

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>::fastAccessDx
          (FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_> *this,int i)

{
  Fad<Fad<double>_> *in_RDI;
  FadExpr<FadUnaryMin<Fad<double>_>_> *in_stack_00000008;
  Fad<double> *in_stack_00000010;
  Fad<double> local_20;
  
  Fad<Fad<double>_>::fastAccessDx(in_RDI,(int)((ulong)in_RDI >> 0x20));
  Fad<double>::operator-(&local_20);
  Fad<double>::Fad<FadUnaryMin<Fad<double>>>(in_stack_00000010,in_stack_00000008);
  FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x1eb317d);
  return (value_type *)in_RDI;
}

Assistant:

value_type fastAccessDx(int i) const { return - right_.fastAccessDx(i);}